

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O1

int luaB_costatus(lua_State *L)

{
  int iVar1;
  lua_State *L_00;
  char *s;
  lua_Debug ar;
  lua_Debug local_90;
  
  L_00 = getco(L);
  if (L_00 == L) {
    s = "running";
  }
  else {
    iVar1 = lua_status(L_00);
    if (iVar1 == 0) {
      iVar1 = lua_getstack(L_00,0,&local_90);
      if (iVar1 < 1) {
        iVar1 = lua_gettop(L_00);
        s = "suspended";
        if (iVar1 == 0) {
          s = "dead";
        }
      }
      else {
        s = "normal";
      }
    }
    else if (iVar1 == 1) {
      s = "suspended";
    }
    else {
      s = "dead";
    }
  }
  lua_pushstring(L,s);
  return 1;
}

Assistant:

static int luaB_costatus(lua_State *L) {
    lua_State *co = getco(L);
    if (L == co) lua_pushliteral(L, "running");
    else {
        switch (lua_status(co)) {
            case LUA_YIELD:
                lua_pushliteral(L, "suspended");
                break;
            case LUA_OK: {
                lua_Debug ar;
                if (lua_getstack(co, 0, &ar) > 0)  /* does it have frames? */
                    lua_pushliteral(L, "normal");  /* it is running */
                else if (lua_gettop(co) == 0)
                    lua_pushliteral(L, "dead");
                else
                    lua_pushliteral(L, "suspended");  /* initial state */
                break;
            }
            default:  /* some error occurred */
                lua_pushliteral(L, "dead");
                break;
        }
    }
    return 1;
}